

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Chapters::ExpandChaptersArray(Chapters *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int iVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  Chapter *pCVar10;
  ulong uVar11;
  Chapter *pCVar12;
  bool bVar13;
  
  iVar3 = this->chapters_size_;
  bVar13 = true;
  if (iVar3 <= this->chapters_count_) {
    iVar6 = 1;
    if (iVar3 != 0) {
      iVar6 = iVar3 * 2;
    }
    uVar11 = (ulong)iVar6;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar11;
    uVar9 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
      uVar9 = SUB168(auVar4 * ZEXT816(0x30),0) | 8;
    }
    puVar7 = (ulong *)operator_new__(uVar9,(nothrow_t *)&std::nothrow);
    if (puVar7 == (ulong *)0x0) {
      pCVar10 = (Chapter *)0x0;
    }
    else {
      *puVar7 = uVar11;
      pCVar10 = (Chapter *)(puVar7 + 1);
      lVar8 = 0;
      pCVar12 = pCVar10;
      do {
        Chapter::Chapter(pCVar12);
        lVar8 = lVar8 + -0x30;
        pCVar12 = pCVar12 + 1;
      } while (-lVar8 != uVar11 * 0x30);
    }
    bVar13 = pCVar10 != (Chapter *)0x0;
    if (bVar13) {
      iVar3 = this->chapters_count_;
      if (0 < (long)iVar3) {
        pCVar12 = this->chapters_;
        lVar8 = 0;
        do {
          *(undefined8 *)((long)&pCVar10->id_ + lVar8) =
               *(undefined8 *)((long)&pCVar12->id_ + lVar8);
          puVar1 = (undefined8 *)((long)&pCVar12->start_timecode_ + lVar8);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pCVar10->start_timecode_ + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          *(undefined8 *)((long)&pCVar10->uid_ + lVar8) =
               *(undefined8 *)((long)&pCVar12->uid_ + lVar8);
          *(undefined8 *)((long)&pCVar10->displays_ + lVar8) =
               *(undefined8 *)((long)&pCVar12->displays_ + lVar8);
          *(undefined8 *)((long)&pCVar10->displays_size_ + lVar8) =
               *(undefined8 *)((long)&pCVar12->displays_size_ + lVar8);
          lVar8 = lVar8 + 0x30;
        } while ((long)iVar3 * 0x30 != lVar8);
      }
      pCVar12 = this->chapters_;
      if (pCVar12 != (Chapter *)0x0) {
        if (*(long *)&pCVar12[-1].displays_size_ != 0) {
          lVar8 = *(long *)&pCVar12[-1].displays_size_ * 0x30;
          do {
            Chapter::~Chapter((Chapter *)((long)&pCVar12[-1].id_ + lVar8));
            lVar8 = lVar8 + -0x30;
          } while (lVar8 != 0);
        }
        operator_delete__(&pCVar12[-1].displays_size_);
      }
      this->chapters_ = pCVar10;
      this->chapters_size_ = iVar6;
    }
  }
  return bVar13;
}

Assistant:

bool Chapters::ExpandChaptersArray() {
  if (chapters_size_ > chapters_count_)
    return true;  // nothing to do yet

  const int size = (chapters_size_ == 0) ? 1 : 2 * chapters_size_;

  Chapter* const chapters = new (std::nothrow) Chapter[size];  // NOLINT
  if (chapters == NULL)
    return false;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& src = chapters_[idx];
    Chapter* const dst = chapters + idx;
    src.ShallowCopy(dst);
  }

  delete[] chapters_;

  chapters_ = chapters;
  chapters_size_ = size;

  return true;
}